

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

void Glucose_CheckTwoNodesTest(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  SimpSolver *pSat;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  
  iVar8 = 0;
  pSat = glucose_solver_start();
  bVar5 = true;
  while( true ) {
    iVar10 = p->vCos->nSize;
    if (iVar10 <= p->nRegs) break;
    if (iVar10 < 1) {
LAB_005bea35:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar4 = p->vCos->pArray;
    iVar7 = *piVar4;
    if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_005be9f7:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar1 = *(uint *)(p->pObjs + iVar7);
    iVar7 = iVar7 - (uVar1 & 0x1fffffff);
    if (iVar7 < 0) {
LAB_005bea54:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    if (iVar10 - p->nRegs == 1) break;
    if (iVar10 == 1) goto LAB_005bea35;
    uVar2 = piVar4[1];
    if (((long)(int)uVar2 < 0) || ((uint)p->nObjs <= uVar2)) goto LAB_005be9f7;
    uVar3 = *(uint *)(p->pObjs + (int)uVar2);
    iVar10 = uVar2 - (uVar3 & 0x1fffffff);
    if (iVar10 < 0) goto LAB_005bea54;
    iVar8 = bmcg_sat_solver_equiv_overlap_check
                      (pSat,p,(uVar1 >> 0x1d & 1) + iVar7 * 2,(uVar3 >> 0x1d & 1) + iVar10 * 2,iVar8
                      );
    (*(pSat->super_Solver)._vptr_Solver[2])(pSat);
    pcVar11 = "Equivalence";
    if (bVar5) {
      pcVar11 = "Overlap";
    }
    pcVar9 = "holds";
    if (iVar8 == 0) {
      pcVar9 = "fails";
    }
    printf("%s %s.\n",pcVar11,pcVar9);
    iVar8 = 1;
    bVar6 = !bVar5;
    bVar5 = false;
    if (bVar6) {
      (*(pSat->super_Solver)._vptr_Solver[1])(pSat);
      return;
    }
  }
  __assert_fail("v < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
}

Assistant:

void Glucose_CheckTwoNodesTest( Gia_Man_t * p )
{
    int n, Res;
    bmcg_sat_solver * pSat = bmcg_sat_solver_start();
    for ( n = 0; n < 2; n++ )
    {
        Res = bmcg_sat_solver_equiv_overlap_check( 
            pSat, p, 
            Gia_ObjFaninLit0p(p, Gia_ManPo(p, 0)), 
            Gia_ObjFaninLit0p(p, Gia_ManPo(p, 1)), 
            n );
        bmcg_sat_solver_reset( pSat );
        printf( "%s %s.\n", n ? "Equivalence" : "Overlap", Res ? "holds" : "fails" );
    }
    bmcg_sat_solver_stop( pSat );
}